

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void CostManagerClear(CostManager *manager)

{
  if (manager != (CostManager *)0x0) {
    WebPSafeFree(manager->costs_);
    WebPSafeFree(manager->cache_intervals_);
    DeleteIntervalList(manager,manager->head_);
    manager->head_ = (CostInterval *)0x0;
    DeleteIntervalList(manager,manager->recycled_intervals_);
    memset(manager,0,0x8178);
    CostManagerInitFreeList(manager);
    return;
  }
  return;
}

Assistant:

static void CostManagerClear(CostManager* const manager) {
  if (manager == NULL) return;

  WebPSafeFree(manager->costs_);
  WebPSafeFree(manager->cache_intervals_);

  // Clear the interval lists.
  DeleteIntervalList(manager, manager->head_);
  manager->head_ = NULL;
  DeleteIntervalList(manager, manager->recycled_intervals_);
  manager->recycled_intervals_ = NULL;

  // Reset pointers, count_ and cache_intervals_size_.
  memset(manager, 0, sizeof(*manager));
  CostManagerInitFreeList(manager);
}